

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::getBlendStateSetName_abi_cxx11_
          (string *__return_storage_ptr__,pipeline *this,
          VkPipelineColorBlendAttachmentState *blendStates)

{
  VkPipelineColorBlendAttachmentState *extraout_RDX;
  VkPipelineColorBlendAttachmentState *blendState;
  VkPipelineColorBlendAttachmentState *extraout_RDX_00;
  long lVar1;
  ostringstream name;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar1 = 0;
  blendState = extraout_RDX;
  while( true ) {
    getBlendStateName_abi_cxx11_(&local_1c8,this + lVar1,blendState);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (lVar1 == 0x60) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
    lVar1 = lVar1 + 0x20;
    blendState = extraout_RDX_00;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getBlendStateSetName (const VkPipelineColorBlendAttachmentState blendStates[BlendTest::QUAD_COUNT])
{
	std::ostringstream name;

	for (int quadNdx = 0; quadNdx < BlendTest::QUAD_COUNT; quadNdx++)
	{
		name << getBlendStateName(blendStates[quadNdx]);

		if (quadNdx < BlendTest::QUAD_COUNT - 1)
			name << "-";
	}

	return name.str();
}